

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_repeat_matcher.hpp
# Opt level: O0

bool __thiscall
boost::xpressive::detail::
simple_repeat_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,mpl_::bool_<false>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (void *param_1,undefined8 *param_2,long *param_3)

{
  undefined8 uVar1;
  bool bVar2;
  ulong uVar3;
  uint matches;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tmp;
  match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb8;
  uint7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  uint local_2c;
  
  uVar1 = *param_2;
  for (local_2c = 0; local_2c < *(uint *)((long)param_1 + 8); local_2c = local_2c + 1) {
    bVar2 = shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::match((shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffb8);
    if (!bVar2) {
      *param_2 = uVar1;
      return false;
    }
  }
  do {
    uVar3 = (**(code **)(*param_3 + 0x10))(param_3,param_2);
    if ((uVar3 & 1) != 0) {
      return true;
    }
    bVar2 = false;
    if (local_2c < *(uint *)((long)param_1 + 0xc)) {
      bVar2 = shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::match((shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(ulong)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    local_2c = local_2c + 1;
  } while (bVar2 != false);
  *param_2 = uVar1;
  return false;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, non_greedy_tag) const
        {
            BOOST_ASSERT(!this->leading_);
            BidiIter const tmp = state.cur_;
            unsigned int matches = 0;

            for(; matches < this->min_; ++matches)
            {
                if(!this->xpr_.match(state))
                {
                    state.cur_ = tmp;
                    return false;
                }
            }

            do
            {
                if(next.match(state))
                {
                    return true;
                }
            }
            while(matches++ < this->max_ && this->xpr_.match(state));

            state.cur_ = tmp;
            return false;
        }